

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t
ctrl_set_number_spatial_layers(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  aom_codec_alg_priv_t_conflict *in_RSI;
  long in_RDI;
  int number_spatial_layers;
  int *local_30;
  aom_codec_err_t local_4;
  
  uVar1 = *(uint *)&(in_RSI->base).err_detail;
  if (uVar1 < 0x29) {
    local_30 = (int *)((long)(int)uVar1 + (long)(in_RSI->base).enc.cx_data_dst_buf.buf);
    *(uint *)&(in_RSI->base).err_detail = uVar1 + 8;
  }
  else {
    local_30 = (int *)(in_RSI->base).init_flags;
    (in_RSI->base).init_flags = (aom_codec_flags_t)(local_30 + 2);
  }
  if (*local_30 < 5) {
    *(int *)(*(long *)(in_RDI + 0xb50) + 0xc75c) = *local_30;
    if (*(int *)(*(long *)(in_RDI + 0xb50) + 0x178) == 0) {
      local_4 = update_encoder_cfg(in_RSI);
    }
    else {
      local_4 = AOM_CODEC_OK;
    }
  }
  else {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  return local_4;
}

Assistant:

static aom_codec_err_t ctrl_set_number_spatial_layers(aom_codec_alg_priv_t *ctx,
                                                      va_list args) {
  const int number_spatial_layers = va_arg(args, int);
  if (number_spatial_layers > MAX_NUM_SPATIAL_LAYERS)
    return AOM_CODEC_INVALID_PARAM;
  ctx->ppi->number_spatial_layers = number_spatial_layers;
  // update_encoder_cfg() is somewhat costly and this control may be called
  // multiple times, so update_encoder_cfg() is only called to ensure frame and
  // superblock sizes are updated before they're fixed by the first encode
  // call.
  if (!ctx->ppi->seq_params_locked) {
    return update_encoder_cfg(ctx);
  }
  return AOM_CODEC_OK;
}